

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canRunCommand(char *cmd)

{
  wchar_t wVar1;
  char *cmd_local;
  
  if (canRunCommand::tested == L'\0') {
    canRunCommand::tested = L'\x01';
    wVar1 = systemf("%s %s",cmd,redirectArgs);
    if (wVar1 == L'\0') {
      canRunCommand::value = L'\x01';
    }
  }
  return canRunCommand::value;
}

Assistant:

int
canRunCommand(const char *cmd)
{
  static int tested = 0, value = 0;
  if (!tested) {
    tested = 1;
    if (systemf("%s %s", cmd, redirectArgs) == 0)
      value = 1;
  }
  return (value);
}